

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O1

int LZ4_compressHC_continue_generic
              (LZ4_streamHC_t *LZ4_streamHCPtr,char *src,char *dst,int *srcSizePtr,int dstCapacity,
              limitedOutput_directive limit)

{
  LZ4_byte *pLVar1;
  uint uVar2;
  LZ4_byte *pLVar3;
  LZ4_u32 LVar4;
  uint uVar5;
  int iVar6;
  LZ4_byte *pLVar7;
  ulong uVar8;
  void *pvVar9;
  
  if (LZ4_streamHCPtr->table[0x8001] == (void *)0x0) {
    pvVar9 = LZ4_streamHCPtr->table[0x8000];
    if ((void *)0x40000000 < pvVar9) {
      pvVar9 = (void *)0x0;
      memset(LZ4_streamHCPtr,0,0x20000);
      memset(LZ4_streamHCPtr->table + 0x4000,0xff,0x20000);
    }
    LVar4 = (int)pvVar9 + 0x10000;
    (LZ4_streamHCPtr->internal_donotuse).nextToUpdate = LVar4;
    LZ4_streamHCPtr->table[0x8001] = src + (-0x10000 - (long)pvVar9);
    (LZ4_streamHCPtr->internal_donotuse).end = (LZ4_byte *)src;
    LZ4_streamHCPtr->table[0x8002] = src + (-0x10000 - (long)pvVar9);
    (LZ4_streamHCPtr->internal_donotuse).dictLimit = LVar4;
    (LZ4_streamHCPtr->internal_donotuse).lowLimit = LVar4;
  }
  uVar8 = (long)(LZ4_streamHCPtr->internal_donotuse).end - (long)LZ4_streamHCPtr->table[0x8001];
  if (0x80000000 < uVar8) {
    uVar8 = uVar8 - (LZ4_streamHCPtr->internal_donotuse).dictLimit;
    if (0xffff < uVar8) {
      uVar8 = 0x10000;
    }
    LZ4_loadDictHC(LZ4_streamHCPtr,(char *)((LZ4_streamHCPtr->internal_donotuse).end + -uVar8),
                   (int)uVar8);
  }
  if ((char *)LZ4_streamHCPtr->table[0x8000] != src) {
    LZ4HC_setExternalDict(&LZ4_streamHCPtr->internal_donotuse,(BYTE *)src);
  }
  pLVar7 = (LZ4_byte *)(src + *srcSizePtr);
  pLVar3 = (LZ4_streamHCPtr->internal_donotuse).dictBase;
  uVar2 = (LZ4_streamHCPtr->internal_donotuse).dictLimit;
  pLVar1 = pLVar3 + uVar2;
  if (src < pLVar1 && pLVar3 + (LZ4_streamHCPtr->internal_donotuse).lowLimit < pLVar7) {
    iVar6 = (int)pLVar7;
    if (pLVar1 < pLVar7) {
      iVar6 = (int)pLVar1;
    }
    uVar5 = iVar6 - (int)pLVar3;
    if (uVar2 - uVar5 < 4) {
      uVar5 = uVar2;
    }
    (LZ4_streamHCPtr->internal_donotuse).lowLimit = uVar5;
  }
  iVar6 = LZ4HC_compress_generic
                    (&LZ4_streamHCPtr->internal_donotuse,src,dst,srcSizePtr,dstCapacity,
                     (int)(LZ4_streamHCPtr->internal_donotuse).compressionLevel,limit);
  return iVar6;
}

Assistant:

static int
LZ4_compressHC_continue_generic (LZ4_streamHC_t* LZ4_streamHCPtr,
                                 const char* src, char* dst,
                                 int* srcSizePtr, int dstCapacity,
                                 limitedOutput_directive limit)
{
    LZ4HC_CCtx_internal* const ctxPtr = &LZ4_streamHCPtr->internal_donotuse;
    DEBUGLOG(5, "LZ4_compressHC_continue_generic(ctx=%p, src=%p, srcSize=%d, limit=%d)",
                LZ4_streamHCPtr, src, *srcSizePtr, limit);
    assert(ctxPtr != NULL);
    /* auto-init if forgotten */
    if (ctxPtr->base == NULL) LZ4HC_init_internal (ctxPtr, (const BYTE*) src);

    /* Check overflow */
    if ((size_t)(ctxPtr->end - ctxPtr->base) > 2 GB) {
        size_t dictSize = (size_t)(ctxPtr->end - ctxPtr->base) - ctxPtr->dictLimit;
        if (dictSize > 64 KB) dictSize = 64 KB;
        LZ4_loadDictHC(LZ4_streamHCPtr, (const char*)(ctxPtr->end) - dictSize, (int)dictSize);
    }

    /* Check if blocks follow each other */
    if ((const BYTE*)src != ctxPtr->end)
        LZ4HC_setExternalDict(ctxPtr, (const BYTE*)src);

    /* Check overlapping input/dictionary space */
    {   const BYTE* sourceEnd = (const BYTE*) src + *srcSizePtr;
        const BYTE* const dictBegin = ctxPtr->dictBase + ctxPtr->lowLimit;
        const BYTE* const dictEnd   = ctxPtr->dictBase + ctxPtr->dictLimit;
        if ((sourceEnd > dictBegin) && ((const BYTE*)src < dictEnd)) {
            if (sourceEnd > dictEnd) sourceEnd = dictEnd;
            ctxPtr->lowLimit = (U32)(sourceEnd - ctxPtr->dictBase);
            if (ctxPtr->dictLimit - ctxPtr->lowLimit < 4) ctxPtr->lowLimit = ctxPtr->dictLimit;
    }   }

    return LZ4HC_compress_generic (ctxPtr, src, dst, srcSizePtr, dstCapacity, ctxPtr->compressionLevel, limit);
}